

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_update.c
# Opt level: O1

lu_int __thiscall lu_update(void *this,double xtbl)

{
  double stretch;
  undefined8 uVar1;
  uint nlines;
  uint j;
  int iVar2;
  long lVar3;
  lu_int *begin;
  long lVar4;
  long lVar5;
  lu_int *index;
  lu_int *pstack;
  long lVar6;
  long lVar7;
  char cVar8;
  int iVar9;
  int iVar10;
  lu_int lVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  undefined8 *puVar20;
  lu_int *plVar21;
  uint uVar22;
  uint uVar23;
  long lVar24;
  int *piVar25;
  lu_int *marked;
  lu_int *next;
  int iVar26;
  double *pdVar27;
  uint *puVar28;
  ulong uVar29;
  int iVar30;
  int *piVar31;
  long lVar32;
  uint uVar33;
  int iVar34;
  long lVar35;
  lu_int *plVar36;
  int iVar37;
  long lVar38;
  uint *xi;
  bool bVar39;
  bool bVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  undefined4 uVar44;
  undefined4 uVar45;
  lu_int *plVar46;
  double dVar47;
  uint local_178;
  lu_int ipivot;
  lu_int *local_138;
  int *local_130;
  lu_int *local_128;
  double *local_120;
  int local_114;
  uint local_110;
  lu_int jpivot;
  lu_int *local_108;
  ulong uStack_100;
  long local_f8;
  long local_f0;
  ulong local_e8;
  double local_e0;
  ulong local_d8;
  long local_d0;
  long local_c8;
  undefined4 local_c0;
  lu_int local_bc;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  double local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  double local_38;
  
  nlines = *(uint *)((long)this + 0x54);
  local_f8 = (long)*(int *)((long)this + 0x68);
  iVar30 = *(int *)((long)this + 0x80);
  uVar33 = *(uint *)((long)this + 0x30);
  local_e8 = (ulong)uVar33;
  stretch = *(double *)((long)this + 0x38);
  lVar13 = *(long *)((long)this + 0x270);
  local_40 = *(long *)((long)this + 0x1d8);
  local_48 = *(long *)((long)this + 0x1e8);
  lVar3 = *(long *)((long)this + 0x280);
  local_d0 = *(long *)((long)this + 0x1f8);
  begin = *(lu_int **)((long)this + 0x218);
  plVar36 = *(lu_int **)((long)this + 0x228);
  local_128 = *(lu_int **)((long)this + 0x238);
  plVar21 = *(lu_int **)((long)this + 0x248);
  local_a0 = *(long *)((long)this + 0x2b0);
  local_c8 = *(long *)((long)this + 0x1a0);
  local_90 = *(long *)((long)this + 0x1b8);
  lVar4 = *(long *)((long)this + 0x1a8);
  lVar5 = *(long *)((long)this + 0x1c0);
  index = *(lu_int **)((long)this + 0x1b0);
  local_120 = *(double **)((long)this + 0x1c8);
  marked = *(lu_int **)((long)this + 0x290);
  local_130 = *(int **)((long)this + 0x210);
  pstack = *(lu_int **)((long)this + 0x2a0);
  j = *(uint *)((long)this + 0x188);
  jpivot = j;
  lVar15 = (long)(int)j;
  iVar34 = *(int *)(*(long *)((long)this + 0x260) + lVar15 * 4);
  ipivot = iVar34;
  local_a8 = *(long *)((long)this + 0x2a8);
  local_38 = *(double *)(*(long *)((long)this + 0x2a8) + lVar15 * 8);
  lVar12 = (long)(int)nlines;
  iVar9 = *(int *)(lVar3 + lVar12 * 4);
  iVar37 = *(int *)(lVar4 + (long)iVar9 * 4);
  local_98 = *(long *)((long)this + 0x260);
  if (iVar37 < 0) {
    local_108 = (lu_int *)0x0;
    bVar40 = true;
  }
  else {
    lVar16 = (long)iVar9 << 2;
    bVar40 = false;
    local_108 = (lu_int *)0x0;
    do {
      if (iVar37 == iVar34) {
        local_108 = *(lu_int **)(lVar5 + lVar16 * 2);
        bVar40 = true;
      }
      else {
        lVar17 = (long)iVar9;
        *(int *)(lVar4 + lVar17 * 4) = iVar37;
        iVar9 = iVar9 + 1;
        *(undefined8 *)(lVar5 + lVar17 * 8) = *(undefined8 *)(lVar5 + lVar16 * 2);
      }
      iVar37 = *(int *)(lVar4 + 4 + lVar16);
      lVar16 = lVar16 + 4;
    } while (-1 < iVar37);
    bVar40 = !bVar40;
  }
  lVar16 = (long)iVar9;
  if (!bVar40) {
    *(int *)(lVar4 + lVar16 * 4) = iVar34;
    *(lu_int **)(lVar5 + lVar16 * 8) = local_108;
  }
  lVar16 = lVar16 - *(int *)(lVar3 + lVar12 * 4);
  iVar9 = *(int *)(local_d0 + local_f8 * 4);
  local_d8 = (ulong)*(uint *)(local_d0 + 4 + local_f8 * 4);
  iVar10 = *(int *)((long)this + 0x18c) + 1;
  *(int *)((long)this + 0x18c) = iVar10;
  iVar37 = *(int *)(local_d0 + local_f8 * 4);
  lVar17 = (long)iVar37;
  if (iVar37 < *(int *)(local_d0 + 4 + local_f8 * 4)) {
    do {
      lVar24 = (long)*(int *)(local_c8 + lVar17 * 4);
      marked[lVar24] = iVar10;
      *(undefined8 *)(pstack + lVar24 * 2) = *(undefined8 *)(local_90 + lVar17 * 8);
      lVar17 = lVar17 + 1;
    } while (lVar17 < *(int *)(local_d0 + 4 + local_f8 * 4));
  }
  lVar17 = (long)*(int *)(lVar3 + lVar12 * 4);
  lVar24 = lVar16 + lVar17;
  iVar37 = (int)lVar16;
  local_138 = local_108;
  if (iVar37 < 1) {
    bVar39 = true;
  }
  else {
    iVar26 = 0;
    lVar16 = lVar17;
    do {
      lVar32 = (long)*(int *)(lVar4 + lVar16 * 4);
      if (marked[lVar32] == iVar10) {
        local_108 = (lu_int *)
                    ((double)local_108 -
                    *(double *)(lVar5 + lVar16 * 8) * *(double *)(pstack + lVar32 * 2));
        iVar26 = iVar26 + 1;
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < lVar24);
    bVar39 = iVar26 == 0;
  }
  lVar11 = -6;
  if (((double)local_108 != 0.0) || (NAN((double)local_108))) {
    local_88 = ABS((double)local_108);
    uStack_80 = 0;
    if (*(double *)((long)this + 0x18) <= ABS((double)local_108)) {
      local_f0 = CONCAT71(local_f0._1_7_,bVar39);
      if (iVar37 < 1) {
        iVar10 = 0;
      }
      else {
        iVar10 = 0;
        do {
          iVar26 = *(int *)(lVar13 + (long)*(int *)(lVar4 + lVar17 * 4) * 4);
          if (plVar36[iVar26] == begin[local_128[iVar26]]) {
            iVar26 = plVar36[iVar26] - begin[iVar26];
            iVar10 = (int)((double)(iVar10 + iVar26 + 1) +
                          (double)(iVar26 + 1) * stretch + (double)(int)uVar33);
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 < (int)lVar24);
      }
      iVar26 = iVar10 - (plVar36[lVar12] - begin[lVar12]);
      if (iVar26 == 0 || iVar10 < plVar36[lVar12] - begin[lVar12]) {
        lVar16 = (long)iVar34;
        lVar17 = (long)*(int *)(lVar3 + lVar16 * 4);
        uVar33 = *(uint *)(lVar4 + lVar17 * 4);
        uStack_100 = 0;
        local_e0 = xtbl;
        if ((int)uVar33 < 0) {
          lVar24 = 0;
        }
        else {
          lVar24 = 0;
          do {
            iVar10 = *(int *)(lVar13 + (ulong)uVar33 * 4);
            iVar26 = plVar36[iVar10];
            plVar36[iVar10] = iVar26 + -1;
            lVar11 = find(j,index,begin[iVar10],iVar26);
            index[lVar11] = index[(long)iVar26 + -1];
            local_120[lVar11] = local_120[(long)iVar26 + -1];
            uVar33 = *(uint *)(lVar17 * 4 + 4 + lVar4 + lVar24 * 4);
            lVar24 = lVar24 + 1;
          } while (-1 < (int)uVar33);
        }
        next = local_128;
        lVar17 = (long)*(int *)(lVar3 + lVar16 * 4);
        if (-1 < *(int *)(lVar4 + lVar17 * 4)) {
          piVar31 = (int *)(lVar4 + lVar17 * 4);
          do {
            piVar25 = piVar31 + 1;
            *piVar31 = -1;
            piVar31 = piVar25;
          } while (-1 < *piVar25);
        }
        *(undefined4 *)(lVar3 + lVar16 * 4) = *(undefined4 *)(lVar3 + lVar12 * 4);
        lVar17 = (long)iVar37 + (long)*(int *)(lVar3 + lVar12 * 4);
        *(int *)(lVar3 + lVar12 * 4) = (int)lVar17 + 1;
        *(undefined4 *)(lVar4 + lVar17 * 4) = 0xffffffff;
        lVar17 = (long)*(int *)(lVar3 + lVar16 * 4);
        uVar33 = *(uint *)(lVar4 + lVar17 * 4);
        plVar46 = local_108;
        uVar18 = uStack_100;
        if (-1 < (int)uVar33) {
          dVar41 = (double)(int)local_e8;
          lVar17 = lVar17 << 2;
          pdVar27 = local_120;
          do {
            iVar10 = *(int *)(lVar13 + (ulong)uVar33 * 4);
            if (plVar36[iVar10] == begin[next[iVar10]]) {
              lu_file_reappend(iVar10,nlines,begin,plVar36,next,plVar21,index,local_120,
                               (int)((double)((plVar36[iVar10] - begin[iVar10]) + 1) * stretch + 1.0
                                    + dVar41));
              pdVar27 = local_120;
              plVar46 = local_108;
              uVar18 = uStack_100;
            }
            iVar26 = plVar36[iVar10];
            plVar36[iVar10] = iVar26 + 1;
            index[iVar26] = j;
            pdVar27[iVar26] = *(double *)(lVar5 + lVar17 * 2);
            uVar33 = *(uint *)(lVar4 + 4 + lVar17);
            lVar17 = lVar17 + 4;
          } while (-1 < (int)uVar33);
        }
        xi = (uint *)(local_130 + lVar12);
        uVar33 = (int)local_d8 - iVar9;
        iVar37 = (iVar30 - (int)lVar24) + iVar37;
        *(lu_int **)(local_a8 + lVar15 * 8) = local_138;
        *(lu_int **)(local_a0 + lVar16 * 8) = local_138;
        local_d8 = (ulong)uVar33;
        if (bVar40) {
          *xi = j;
          uVar33 = 1;
          lVar15 = 0;
          bVar40 = false;
          do {
            uVar14 = xi[lVar15];
            lVar17 = (long)begin[(int)uVar14];
            if (begin[(int)uVar14] < plVar36[(int)uVar14]) {
              do {
                uVar23 = index[lVar17];
                if (uVar23 == j) {
                  bVar40 = true;
                  break;
                }
                if (-1 < marked[(int)uVar23]) {
                  marked[(int)uVar23] = ~uVar14;
                  lVar24 = (long)(int)uVar33;
                  uVar33 = uVar33 + 1;
                  xi[lVar24] = uVar23;
                }
                lVar17 = lVar17 + 1;
              } while (lVar17 < plVar36[(int)uVar14]);
            }
            lVar15 = lVar15 + 1;
          } while ((lVar15 < (int)uVar33) && (!bVar40));
          uVar23 = nlines;
          if (bVar40) {
            uVar22 = nlines;
            if (uVar14 != j) {
              puVar28 = (uint *)(local_130 + lVar12);
              uVar18 = (ulong)nlines;
              do {
                puVar28 = puVar28 + -1;
                *puVar28 = uVar14;
                uVar14 = ~marked[(int)uVar14];
                uVar22 = (int)uVar18 - 1;
                uVar18 = (ulong)uVar22;
              } while (j != uVar14);
            }
            uVar23 = uVar22 - 1;
            local_130[(long)(int)uVar22 + -1] = j;
          }
          local_138 = plVar36;
          if (0 < (int)uVar33) {
            uVar18 = 0;
            do {
              marked[(int)xi[uVar18]] = 0;
              uVar18 = uVar18 + 1;
            } while (uVar33 != uVar18);
          }
          iVar34 = *(int *)((long)this + 0x18c) + 1;
          *(int *)((long)this + 0x18c) = iVar34;
          bVar40 = true;
          iVar30 = (int)(lVar12 + -1);
          lVar15 = (long)(int)uVar23;
          local_178 = nlines;
          if ((int)uVar23 < iVar30) {
            do {
              lVar17 = lVar15 + 1;
              iVar9 = local_130[lVar15];
              uVar33 = local_130[lVar17];
              lVar11 = find(uVar33,index,begin[iVar9],plVar36[iVar9]);
              index[lVar11] = iVar9;
              local_178 = lu_dfs(iVar9,begin,plVar36,index,local_178,(lu_int *)xi,pstack,marked,
                                 iVar34);
              xi[(int)local_178] = uVar33;
              index[lVar11] = uVar33;
              bVar40 = marked[(int)uVar33] != iVar34;
              if (lVar12 + -1 <= lVar17) break;
              lVar15 = lVar17;
            } while (marked[(int)uVar33] != iVar34);
          }
          plVar36 = local_138;
          bVar39 = false;
          if (bVar40) {
            iVar30 = local_130[iVar30];
            local_178 = lu_dfs(iVar30,begin,local_138,index,local_178,(lu_int *)xi,pstack,marked,
                               iVar34);
            xi[(int)local_178] = j;
            iVar9 = marked[iVar30];
            marked[iVar30] = iVar9 + -1;
            lVar15 = (long)*(int *)(lVar3 + lVar16 * 4);
            uVar33 = *(uint *)(lVar4 + lVar15 * 4);
            if ((int)uVar33 < 0) {
              bVar39 = true;
            }
            else {
              puVar28 = (uint *)(lVar4 + lVar15 * 4);
              bVar39 = true;
              do {
                puVar28 = puVar28 + 1;
                if (marked[*(int *)(lVar13 + (ulong)uVar33 * 4)] == iVar34) {
                  bVar39 = false;
                }
                uVar33 = *puVar28;
              } while (-1 < (int)uVar33);
            }
            marked[iVar30] = iVar9;
          }
          if (bVar39) {
            local_110 = ~uVar23 + nlines;
            piVar31 = local_130 + (int)uVar23;
            lVar13 = *(long *)((long)this + 0x260);
            local_60 = *(long *)((long)this + 0x270);
            lVar15 = *(long *)((long)this + 0x280);
            lVar16 = *(long *)((long)this + 0x218);
            lVar17 = *(long *)((long)this + 0x228);
            lVar24 = *(long *)((long)this + 0x2a8);
            lVar32 = *(long *)((long)this + 0x2b0);
            local_b8 = *(long *)((long)this + 0x1a8);
            plVar36 = *(lu_int **)((long)this + 0x1b0);
            lVar6 = *(long *)((long)this + 0x1c0);
            local_70 = (long)piVar31[(int)local_110];
            local_b0 = (long)*piVar31;
            local_78 = *(undefined8 *)(lVar24 + local_70 * 8);
            lVar7 = *(long *)((long)this + 0x1c8);
            local_68 = (long)*(int *)(lVar13 + local_b0 * 4);
            local_114 = *(int *)(lVar13 + local_70 * 4);
            local_c0 = *(undefined4 *)(lVar16 + local_70 * 4);
            local_bc = *(lu_int *)(lVar17 + local_70 * 4);
            uVar18 = (ulong)local_110;
            if (0 < (int)local_110) {
              local_50 = *(long *)((long)this + 0x238);
              local_58 = *(long *)((long)this + 0x248);
              lVar38 = uVar18 + 1;
              local_f0 = lVar16;
              do {
                iVar30 = piVar31[lVar38 + -2];
                iVar34 = piVar31[lVar38 + -1];
                lVar35 = (long)iVar30;
                lVar16 = (long)iVar34;
                *(undefined4 *)(local_f0 + lVar16 * 4) = *(undefined4 *)(local_f0 + lVar35 * 4);
                *(undefined4 *)(lVar17 + lVar16 * 4) = *(undefined4 *)(lVar17 + lVar35 * 4);
                iVar9 = *(int *)(local_50 + lVar16 * 4);
                iVar10 = *(int *)(local_50 + lVar35 * 4);
                iVar26 = *(int *)(local_58 + lVar16 * 4);
                if (iVar9 == iVar30) {
                  *(int *)(local_50 + lVar35 * 4) = iVar34;
                  *(int *)(local_58 + lVar16 * 4) = iVar30;
LAB_003c37f2:
                  *(int *)(local_50 + (long)iVar26 * 4) = iVar30;
                  *(int *)(local_58 + lVar35 * 4) = iVar26;
                  *(int *)(local_50 + lVar16 * 4) = iVar10;
                  *(int *)(local_58 + (long)iVar10 * 4) = iVar34;
                }
                else {
                  iVar2 = *(int *)(local_58 + lVar35 * 4);
                  if (iVar10 != iVar34) {
                    *(int *)(local_50 + lVar35 * 4) = iVar9;
                    *(int *)(local_58 + (long)iVar9 * 4) = iVar30;
                    *(int *)(local_50 + (long)iVar2 * 4) = iVar34;
                    *(int *)(local_58 + lVar16 * 4) = iVar2;
                    goto LAB_003c37f2;
                  }
                  *(int *)(local_50 + lVar16 * 4) = iVar30;
                  *(int *)(local_58 + lVar35 * 4) = iVar34;
                  *(int *)(local_50 + lVar35 * 4) = iVar9;
                  *(int *)(local_58 + (long)iVar9 * 4) = iVar30;
                  *(int *)(local_50 + (long)iVar2 * 4) = iVar34;
                  *(int *)(local_58 + lVar16 * 4) = iVar2;
                }
                iVar9 = *(int *)(lVar17 + lVar16 * 4);
                lVar11 = find(iVar34,plVar36,*(lu_int *)(local_f0 + lVar16 * 4),iVar9);
                lVar19 = (long)lVar11;
                if (lVar38 == 2) {
                  *(undefined8 *)(lVar24 + lVar16 * 8) = *(undefined8 *)(lVar7 + lVar19 * 8);
                  *(int *)(lVar17 + lVar16 * 4) = iVar9 + -1;
                  plVar36[lVar19] = plVar36[(long)iVar9 + -1];
                  puVar20 = (undefined8 *)(lVar7 + (long)*(int *)(lVar17 + lVar16 * 4) * 8);
                }
                else {
                  plVar36[lVar19] = iVar30;
                  *(undefined8 *)(lVar24 + lVar16 * 8) = *(undefined8 *)(lVar7 + lVar19 * 8);
                  puVar20 = (undefined8 *)(lVar24 + lVar35 * 8);
                }
                *(undefined8 *)(lVar7 + lVar19 * 8) = *puVar20;
                dVar42 = ABS(*(double *)(lVar24 + lVar16 * 8));
                dVar41 = *(double *)((long)this + 0x88);
                dVar47 = *(double *)((long)this + 0x90);
                dVar43 = dVar42;
                if (dVar41 <= dVar42) {
                  dVar43 = dVar41;
                }
                *(ulong *)((long)this + 0x88) =
                     ~-(ulong)NAN(dVar41) & (ulong)dVar43 | -(ulong)NAN(dVar41) & (ulong)dVar42;
                dVar43 = ABS(*(double *)(lVar24 + lVar16 * 8));
                dVar41 = dVar43;
                if (dVar43 <= dVar47) {
                  dVar41 = dVar47;
                }
                *(ulong *)((long)this + 0x90) =
                     ~-(ulong)NAN(dVar47) & (ulong)dVar41 | -(ulong)NAN(dVar47) & (ulong)dVar43;
                lVar38 = lVar38 + -1;
                lVar16 = local_f0;
              } while (1 < lVar38);
            }
            lVar38 = local_b0;
            next = local_128;
            lVar35 = (long)local_114;
            *(undefined4 *)(lVar16 + local_b0 * 4) = local_c0;
            *(lu_int *)(lVar17 + local_b0 * 4) = local_bc;
            lVar11 = find((lu_int)local_b0,plVar36,*(lu_int *)(lVar16 + local_b0 * 4),local_bc);
            lVar16 = (long)lVar11;
            plVar36[lVar16] = (lu_int)local_70;
            *(undefined8 *)(lVar24 + lVar38 * 8) = *(undefined8 *)(lVar7 + lVar16 * 8);
            *(undefined8 *)(lVar7 + lVar16 * 8) = local_78;
            dVar42 = ABS(*(double *)(lVar24 + lVar38 * 8));
            dVar41 = *(double *)((long)this + 0x88);
            dVar47 = *(double *)((long)this + 0x90);
            dVar43 = dVar42;
            if (dVar41 <= dVar42) {
              dVar43 = dVar41;
            }
            *(ulong *)((long)this + 0x88) =
                 ~-(ulong)NAN(dVar41) & (ulong)dVar43 | -(ulong)NAN(dVar41) & (ulong)dVar42;
            dVar43 = ABS(*(double *)(lVar24 + lVar38 * 8));
            dVar41 = dVar43;
            if (dVar43 <= dVar47) {
              dVar41 = dVar47;
            }
            *(ulong *)((long)this + 0x90) =
                 ~-(ulong)NAN(dVar47) & (ulong)dVar41 | -(ulong)NAN(dVar47) & (ulong)dVar43;
            iVar30 = *(int *)(lVar15 + local_68 * 4);
            if (0 < (int)local_110) {
              uVar29 = 0;
              do {
                iVar34 = *(int *)(lVar13 + (long)piVar31[uVar29] * 4);
                lVar16 = uVar29 + 1;
                uVar29 = uVar29 + 1;
                iVar9 = *(int *)(lVar13 + (long)piVar31[lVar16] * 4);
                iVar10 = *(int *)(lVar15 + (long)iVar9 * 4);
                *(int *)(lVar15 + (long)iVar34 * 4) = iVar10;
                piVar25 = (int *)(local_b8 + (long)iVar10 * 4);
                lVar16 = ((long)iVar10 << 0x20) + -0x100000000;
                do {
                  iVar10 = *piVar25;
                  lVar16 = lVar16 + 0x100000000;
                  if (iVar10 == iVar34) break;
                  piVar25 = piVar25 + 1;
                } while (-1 < iVar10);
                lVar16 = lVar16 >> 0x20;
                if (iVar10 != iVar34) {
                  lVar16 = -1;
                }
                *(int *)(local_b8 + lVar16 * 4) = iVar9;
                *(undefined8 *)(lVar32 + (long)iVar34 * 8) = *(undefined8 *)(lVar6 + lVar16 * 8);
                *(undefined8 *)(lVar6 + lVar16 * 8) = *(undefined8 *)(lVar32 + (long)iVar9 * 8);
              } while (uVar29 != uVar18);
            }
            *(int *)(lVar15 + lVar35 * 4) = iVar30;
            piVar25 = (int *)(local_b8 + (long)iVar30 * 4);
            lVar15 = ((long)iVar30 << 0x20) + -0x100000000;
            do {
              iVar30 = *piVar25;
              lVar15 = lVar15 + 0x100000000;
              if (iVar30 == local_114) break;
              piVar25 = piVar25 + 1;
            } while (-1 < iVar30);
            lVar16 = -1;
            if (iVar30 == local_114) {
              lVar16 = lVar15 >> 0x20;
            }
            *(undefined8 *)(lVar32 + lVar35 * 8) = *(undefined8 *)(lVar6 + lVar16 * 8);
            lVar15 = (lVar16 << 0x20) + -0x200000000;
            piVar25 = (int *)(local_b8 + lVar16 * 4);
            do {
              lVar15 = lVar15 + 0x100000000;
              iVar30 = *piVar25;
              piVar25 = piVar25 + 1;
            } while (-1 < iVar30);
            *(undefined4 *)(local_b8 + lVar16 * 4) = *(undefined4 *)(local_b8 + (lVar15 >> 0x1e));
            *(undefined8 *)(lVar6 + lVar16 * 8) = *(undefined8 *)(lVar6 + (lVar15 >> 0x1d));
            *(undefined4 *)(local_b8 + (lVar15 >> 0x1e)) = 0xffffffff;
            if (0 < (int)local_110) {
              lVar15 = uVar18 + 1;
              do {
                iVar30 = piVar31[lVar15 + -1];
                iVar34 = *(int *)(lVar13 + (long)piVar31[lVar15 + -2] * 4);
                *(int *)(lVar13 + (long)iVar30 * 4) = iVar34;
                *(int *)(local_60 + (long)iVar34 * 4) = iVar30;
                lVar15 = lVar15 + -1;
              } while (1 < lVar15);
            }
            *(int *)(lVar13 + local_b0 * 4) = local_114;
            *(int *)(local_60 + lVar35 * 4) = (int)local_b0;
            iVar37 = iVar37 + -1;
            xi = xi + (int)local_178;
            piVar31 = local_130 + (int)local_178;
            cVar8 = '\x01';
            marked = (lu_int *)(ulong)(nlines - local_178);
            plVar21 = marked;
            piVar25 = piVar31;
            plVar36 = local_138;
            plVar46 = local_108;
            uVar18 = uStack_100;
            if (nlines - local_178 != 0 && (int)local_178 <= (int)nlines) {
              do {
                *piVar25 = *(int *)(local_98 + (long)piVar25[lVar12] * 4);
                plVar21 = (lu_int *)((long)plVar21 + -1);
                piVar25 = piVar25 + 1;
              } while (plVar21 != (lu_int *)0x0);
            }
          }
          else {
            xi = (uint *)0x0;
            next = local_128;
            piVar31 = (int *)0x0;
            plVar46 = local_108;
            uVar18 = uStack_100;
            cVar8 = '\0';
          }
        }
        else {
          cVar8 = (char)local_f0;
          if ((char)local_f0 == '\0') {
            xi = (uint *)0x0;
            piVar31 = (int *)0x0;
          }
          else {
            dVar41 = *(double *)((long)this + 0x88);
            dVar47 = *(double *)((long)this + 0x90);
            uVar44 = SUB84(local_88,0);
            uVar45 = (undefined4)((ulong)local_88 >> 0x20);
            if (dVar41 <= local_88) {
              uVar44 = SUB84(dVar41,0);
              uVar45 = (undefined4)((ulong)dVar41 >> 0x20);
            }
            *(ulong *)((long)this + 0x88) =
                 ~-(ulong)NAN(dVar41) & CONCAT44(uVar45,uVar44) |
                 -(ulong)NAN(dVar41) & (ulong)local_88;
            dVar41 = local_88;
            if (local_88 <= dVar47) {
              dVar41 = dVar47;
            }
            *(ulong *)((long)this + 0x90) =
                 ~-(ulong)NAN(dVar47) & (ulong)dVar41 | -(ulong)NAN(dVar47) & (ulong)local_88;
            *local_130 = iVar34;
            *xi = j;
            if (0 < (int)uVar33) {
              iVar30 = *(int *)(local_d0 + local_f8 * 4);
              lVar15 = 0;
              do {
                iVar34 = *(int *)(local_c8 + (long)iVar30 * 4 + lVar15 * 4);
                local_130[lVar15 + 1] = iVar34;
                local_130[lVar12 + lVar15 + 1] = *(int *)(lVar13 + (long)iVar34 * 4);
                lVar15 = lVar15 + 1;
              } while ((ulong)(uVar33 + 1) - 1 != lVar15);
            }
            marked = (lu_int *)(ulong)(uVar33 + 1);
            *(int *)((long)this + 0x78) = *(int *)((long)this + 0x78) + 1;
            piVar31 = local_130;
          }
        }
        uVar33 = (uint)marked;
        if (cVar8 == '\0') {
          lVar13 = (long)jpivot;
          lVar15 = (long)begin[lVar13];
          if (begin[lVar13] < plVar36[lVar13]) {
            do {
              iVar30 = *(int *)(lVar3 + (long)*(int *)(local_98 + (long)index[lVar15] * 4) * 4);
              iVar34 = *(int *)(lVar4 + (long)iVar30 * 4);
              if (iVar34 < 0) {
                lVar16 = -1;
              }
              else {
                piVar31 = (int *)(lVar4 + 4 + (long)iVar30 * 4);
                iVar9 = -1;
                do {
                  if (iVar34 == ipivot) {
                    iVar9 = iVar30;
                  }
                  iVar34 = *piVar31;
                  iVar30 = iVar30 + 1;
                  piVar31 = piVar31 + 1;
                } while (-1 < iVar34);
                lVar16 = (long)iVar9;
              }
              lVar17 = (long)iVar30;
              *(undefined4 *)(lVar4 + lVar16 * 4) = *(undefined4 *)(lVar4 + -4 + lVar17 * 4);
              *(undefined8 *)(lVar5 + lVar16 * 8) = *(undefined8 *)(lVar5 + -8 + lVar17 * 8);
              *(undefined4 *)(lVar4 + -4 + lVar17 * 4) = 0xffffffff;
              iVar37 = iVar37 + -1;
              lVar15 = lVar15 + 1;
            } while (lVar15 < plVar36[lVar13]);
          }
          plVar36[lVar13] = begin[lVar13];
          *(lu_int **)(local_a8 + lVar13 * 8) = plVar46;
          *(lu_int **)(local_a0 + (long)ipivot * 8) = plVar46;
          dVar41 = *(double *)((long)this + 0x88);
          dVar47 = *(double *)((long)this + 0x90);
          uVar44 = SUB84(local_88,0);
          uVar45 = (undefined4)((ulong)local_88 >> 0x20);
          if (dVar41 <= local_88) {
            uVar44 = SUB84(dVar41,0);
            uVar45 = (undefined4)((ulong)dVar41 >> 0x20);
          }
          *(ulong *)((long)this + 0x88) =
               ~-(ulong)NAN(dVar41) & CONCAT44(uVar45,uVar44) |
               -(ulong)NAN(dVar41) & (ulong)local_88;
          dVar41 = local_88;
          if (local_88 <= dVar47) {
            dVar41 = dVar47;
          }
          *(ulong *)((long)this + 0x90) =
               ~-(ulong)NAN(dVar47) & (ulong)dVar41 | -(ulong)NAN(dVar47) & (ulong)local_88;
          iVar30 = *(int *)(local_d0 + local_f8 * 4);
          if (iVar30 < *(int *)(local_d0 + 4 + local_f8 * 4)) {
            lVar13 = (long)iVar30;
            iVar34 = 0;
            uVar44 = 0;
            uVar45 = 0;
            do {
              dVar41 = *(double *)(local_90 + lVar13 * 8);
              if ((dVar41 != 0.0) || (NAN(dVar41))) {
                dVar47 = ABS(dVar41);
                uVar29 = -(ulong)(NAN((double)CONCAT44(uVar45,uVar44)) ||
                                 NAN((double)CONCAT44(uVar45,uVar44)));
                uVar18 = uVar29 & (ulong)dVar47;
                if (dVar47 <= (double)CONCAT44(uVar45,uVar44)) {
                  dVar47 = (double)CONCAT44(uVar45,uVar44);
                }
                uVar18 = ~uVar29 & (ulong)dVar47 | uVar18;
                lVar15 = (long)iVar30;
                *(undefined4 *)(local_c8 + lVar15 * 4) = *(undefined4 *)(local_c8 + lVar13 * 4);
                iVar30 = iVar30 + 1;
                *(double *)(local_90 + lVar15 * 8) = dVar41;
                iVar34 = iVar34 + 1;
                uVar44 = (undefined4)uVar18;
                uVar45 = (undefined4)(uVar18 >> 0x20);
                plVar46 = local_108;
                uVar18 = uStack_100;
              }
              lVar13 = lVar13 + 1;
            } while (lVar13 < *(int *)(local_d0 + 4 + local_f8 * 4));
          }
          else {
            uVar44 = 0;
            uVar45 = 0;
            iVar34 = 0;
          }
          *(int *)(local_d0 + 4 + local_f8 * 4) = iVar30;
          *(int *)((long)this + 0x84) = *(int *)((long)this + 0x84) + iVar34;
          dVar41 = *(double *)((long)this + 0x98);
          uVar29 = CONCAT44(uVar45,uVar44);
          if ((double)CONCAT44(uVar45,uVar44) <= dVar41) {
            uVar44 = SUB84(dVar41,0);
            uVar45 = (undefined4)((ulong)dVar41 >> 0x20);
          }
          *(ulong *)((long)this + 0x98) =
               ~-(ulong)NAN(dVar41) & CONCAT44(uVar45,uVar44) | -(ulong)NAN(dVar41) & uVar29;
          *(int *)((long)this + 0x68) = *(int *)((long)this + 0x68) + 1;
          *(int *)((long)this + 0x74) = *(int *)((long)this + 0x74) + 1;
          piVar31 = &ipivot;
          xi = (uint *)&jpivot;
          uVar33 = 1;
        }
        iVar30 = *(int *)((long)this + 400) + uVar33;
        if (iVar30 != nlines * 2 && SBORROW4(iVar30,nlines * 2) == (int)(iVar30 + nlines * -2) < 0)
        {
          lu_garbage_perm(this);
          plVar46 = local_108;
          uVar18 = uStack_100;
        }
        local_e0 = local_e0 * local_38;
        if (0 < (int)uVar33) {
          iVar30 = *(int *)((long)this + 400);
          uVar29 = 0;
          do {
            *(int *)(local_48 + (long)iVar30 * 4 + uVar29 * 4) = piVar31[uVar29];
            uVar29 = uVar29 + 1;
          } while (uVar33 != uVar29);
        }
        if (0 < (int)uVar33) {
          iVar30 = *(int *)((long)this + 400);
          uVar29 = 0;
          do {
            *(uint *)(local_40 + (long)iVar30 * 4 + uVar29 * 4) = xi[uVar29];
            uVar29 = uVar29 + 1;
          } while (uVar33 != uVar29);
        }
        local_108 = (lu_int *)ABS((double)plVar46 - local_e0);
        uStack_100 = uVar18 & 0x7fffffffffffffff;
        *(int *)((long)this + 400) = *(int *)((long)this + 400) + uVar33;
        uVar33 = *(uint *)(lVar3 + lVar12 * 4);
        if ((double)(int)uVar33 * *(double *)((long)this + 0x40) <
            (double)(int)((uVar33 - iVar37) - nlines)) {
          if (0 < (int)nlines) {
            iVar30 = -2;
            uVar18 = 0;
            do {
              lVar13 = (long)*(int *)(lVar3 + uVar18 * 4);
              iVar34 = *(int *)(lVar4 + lVar13 * 4);
              if (iVar34 == -1) {
                *(undefined4 *)(lVar3 + uVar18 * 4) = 0;
              }
              else {
                *(int *)(lVar3 + uVar18 * 4) = iVar34;
                *(int *)(lVar4 + lVar13 * 4) = iVar30;
              }
              uVar18 = uVar18 + 1;
              iVar30 = iVar30 + -1;
            } while (nlines != uVar18);
          }
          iVar30 = 1;
          if (1 < (int)uVar33) {
            uVar29 = 0xffffffff;
            uVar18 = 1;
            iVar34 = iVar30;
            do {
              iVar30 = *(int *)(lVar4 + uVar18 * 4);
              if (iVar30 < 0) {
                if (iVar30 != -1) {
                  uVar29 = (ulong)(-iVar30 - 2);
                  *(undefined4 *)(lVar4 + (long)iVar34 * 4) = *(undefined4 *)(lVar3 + uVar29 * 4);
                  *(int *)(lVar3 + uVar29 * 4) = iVar34;
                  uVar1 = *(undefined8 *)(lVar5 + uVar18 * 8);
                  goto LAB_003c4090;
                }
                iVar30 = iVar34;
                if (-1 < (int)uVar29) {
                  iVar30 = iVar34 + 1;
                  *(undefined4 *)(lVar4 + (long)iVar34 * 4) = 0xffffffff;
                }
                uVar29 = 0xffffffff;
              }
              else {
                *(int *)(lVar4 + (long)iVar34 * 4) = iVar30;
                uVar1 = *(undefined8 *)(lVar5 + uVar18 * 8);
LAB_003c4090:
                iVar30 = iVar34 + 1;
                *(undefined8 *)(lVar5 + (long)iVar34 * 8) = uVar1;
              }
              uVar18 = uVar18 + 1;
              iVar34 = iVar30;
            } while (uVar33 != uVar18);
          }
          *(int *)(lVar3 + lVar12 * 4) = iVar30;
        }
        if ((double)begin[lVar12] * *(double *)((long)this + 0x40) <
            (double)(begin[lVar12] -
                    (int)((double)(int)((int)local_e8 * nlines) +
                         stretch * (double)iVar37 + (double)iVar37))) {
          lu_file_compress(nlines,begin,plVar36,next,index,local_120,stretch,(int)local_e8);
        }
        *(double *)((long)this + 0x170) = (double)local_108 / (local_88 + 1.0);
        *(int *)((long)this + 0x80) = iVar37;
        *(undefined8 *)((long)this + 0x184) = 0xffffffffffffffff;
        *(double *)((long)this + 0xa0) = (double)(int)local_d8 + *(double *)((long)this + 0xa0);
        *(int *)((long)this + 100) = *(int *)((long)this + 100) + 1;
        *(int *)((long)this + 0x70) = *(int *)((long)this + 0x70) + 1;
        lVar11 = 0;
      }
      else {
        *(int *)((long)this + 0x60) = iVar26;
        lVar11 = 1;
      }
    }
  }
  return lVar11;
}

Assistant:

lu_int lu_update(struct lu *this, double xtbl)
{
    const lu_int m          = this->m;
    const lu_int nforrest   = this->nforrest;
    lu_int Unz              = this->Unz;
    const lu_int pad        = this->pad;
    const double stretch    = this->stretch;
    lu_int *pmap            = this->pmap;
    lu_int *qmap            = this->qmap;
    lu_int *pivotcol        = this->pivotcol;
    lu_int *pivotrow        = this->pivotrow;
    lu_int *Ubegin          = this->Ubegin;
    lu_int *Rbegin          = this->Rbegin;
    lu_int *Wbegin          = this->Wbegin;
    lu_int *Wend            = this->Wend;
    lu_int *Wflink          = this->Wflink;
    lu_int *Wblink          = this->Wblink;
    double *col_pivot       = this->col_pivot;
    double *row_pivot       = this->row_pivot;
    lu_int *Lindex          = this->Lindex;
    double *Lvalue          = this->Lvalue;
    lu_int *Uindex          = this->Uindex;
    double *Uvalue          = this->Uvalue;
    lu_int *Windex          = this->Windex;
    double *Wvalue          = this->Wvalue;
    lu_int *marked          = this->marked;
    lu_int *iwork1          = this->iwork1;
    lu_int *iwork2          = iwork1 + m;
    double *work1           = this->work1;

    lu_int jpivot = this->btran_for_update;
    lu_int ipivot = pmap[jpivot];
    double oldpiv = col_pivot[jpivot];
    lu_int status = BASICLU_OK;

    lu_int i, j, jnext, n, nz, t, put, pos, end, where, room, grow, used,need,M;
    lu_int have_diag, intersect, istriangular, nz_roweta, nz_spike;
    lu_int nreach, *col_reach, *row_reach;
    double spike_diag, newpiv, piverr;

    assert(nforrest < m);

    /*
     * Note: If the singularity test fails or memory is insufficient, then the
     *       update is aborted and the user may call this routine a second time.
     *       Changes made to data structures in the first call must not violate
     *       the logic in the second call.
     */

    /* ------- */
    /* Prepare */
    /* ------- */

    /* if present, move diagonal element to end of spike */
    spike_diag = 0.0;
    have_diag = 0;
    put = Ubegin[m];
    for (pos = put; (i = Uindex[pos]) >= 0; pos++)
    {
        if (i != ipivot)
        {
            Uindex[put] = i;
            Uvalue[put++] = Uvalue[pos];
        }
        else
        {
            spike_diag = Uvalue[pos];
            have_diag = 1;
        }
    }
    if (have_diag)
    {
        Uindex[put] = ipivot;
        Uvalue[put] = spike_diag;
    }
    nz_spike = put - Ubegin[m]; /* nz excluding diagonal */

    nz_roweta = Rbegin[nforrest+1] - Rbegin[nforrest];

    /* ------------- */
    /* Compute pivot */
    /* ------------- */

    /*
     * newpiv is the diagonal element in the spike column after the
     * Forrest-Tomlin update has been applied. It can be computed as
     *
     *    newpiv = spike_diag - dot(spike,row eta)                (1)
     * or
     *    newpiv = xtbl * oldpiv,                                 (2)
     *
     * where spike_diag is the diagonal element in the spike column
     * before the Forrest-Tomlin update and oldpiv was the pivot element
     * in column jpivot before inserting the spike. This routine uses
     * newpiv from (1) and reports the difference to (2) to the user
     * to monitor numerical stability.
     *
     * While computing (1), count intersection of patterns of spike and
     * row eta.
     */

    /* scatter row eta into work1 and mark positions */
    M = ++this->marker;
    for (pos = Rbegin[nforrest]; pos < Rbegin[nforrest+1]; pos++)
    {
        i = Lindex[pos];
        marked[i] = M;
        work1[i] = Lvalue[pos];
    }

    /* compute newpiv and count intersection */
    newpiv = spike_diag;
    intersect = 0;
    for (pos = Ubegin[m]; pos < Ubegin[m] + nz_spike; pos++)
    {
        i = Uindex[pos];
        assert(i != ipivot);
        if (marked[i] == M)
        {
            newpiv -= Uvalue[pos] * work1[i];
            intersect++;
        }
    }

    /* singularity test */
    if (newpiv == 0 || fabs(newpiv) < this->abstol)
    {
        status = BASICLU_ERROR_singular_update;
        return status;
    }

    /* stability measure */
    piverr = fabs(newpiv - xtbl*oldpiv);

    /* ------------ */
    /* Insert spike */
    /* ------------ */

    /* calculate bound on file growth */
    grow = 0;
    for (pos = Ubegin[m]; pos < Ubegin[m] + nz_spike; pos++)
    {
        i = Uindex[pos];
        assert(i != ipivot);
        j = qmap[i];
        jnext = Wflink[j];
        if (Wend[j] == Wbegin[jnext])
        {
            nz = Wend[j] - Wbegin[j];
            grow += nz+1;                 /* row including spike entry */
            grow += stretch*(nz+1) + pad; /* extra room */
        }
    }

    /* reallocate if necessary */
    room = Wend[m] - Wbegin[m];
    if (grow > room)
    {
        this->addmemW = grow-room;
        status = BASICLU_REALLOCATE;
        return status;
    }

    /* remove column jpivot from row file */
    nz = 0;
    for (pos = Ubegin[ipivot]; (i = Uindex[pos]) >= 0; pos++)
    {
        j = qmap[i];
        end = Wend[j]--;
        where = find(jpivot, Windex, Wbegin[j], end);
        assert(where < end);
        Windex[where] = Windex[end-1];
        Wvalue[where] = Wvalue[end-1];
        nz++;
    }
    Unz -= nz;

    /* erase column jpivot in column file */
    for (pos = Ubegin[ipivot]; Uindex[pos] >= 0; pos++)
    {
        Uindex[pos] = GAP;
    }

    /* set column pointers to spike, chop off diagonal */
    Ubegin[ipivot] = Ubegin[m];
    Ubegin[m] += nz_spike;
    Uindex[Ubegin[m]++] = GAP;

    /* insert spike into row file */
    for (pos = Ubegin[ipivot]; (i = Uindex[pos]) >= 0; pos++)
    {
        j = qmap[i];
        jnext = Wflink[j];
        if (Wend[j] == Wbegin[jnext])
        {
            nz = Wend[j] - Wbegin[j];
            room = 1 + stretch*(nz+1) + pad;
            lu_file_reappend(j, m, Wbegin, Wend, Wflink, Wblink, Windex,
                             Wvalue, room);
        }
        end = Wend[j]++;
        Windex[end] = jpivot;
        Wvalue[end] = Uvalue[pos];
    }
    Unz += nz_spike;

    /* insert diagonal */
    col_pivot[jpivot] = spike_diag;
    row_pivot[ipivot] = spike_diag;

    /* ------------------ */
    /* Test triangularity */
    /* ------------------ */

    row_reach = NULL;
    col_reach = NULL;

    if (have_diag)
    {
        /*
         * When the spike has a nonzero diagonal element, then the spiked matrix
         * is (symmetrically) permuted triangular if and only if reach(ipivot)
         * does not intersect with the spike pattern except for ipivot. Since
         * reach(ipivot) \ {ipivot} is the structural pattern of the row eta,
         * the matrix is permuted triangular iff the patterns of the row eta
         * and the spike do not intersect.
         *
         * To update the permutations below, we have to provide reach(ipivot)
         * and the associated column indices in topological order as arrays
         * row_reach[0..nreach-1] and col_reach[0..nreach-1]. Because the
         * pattern of the row eta was computed by a dfs, we obtain row_reach
         * simply by adding ipivot to the front. col_reach can then be obtained
         * through qmap.
         */
        istriangular = intersect == 0;
        if (istriangular)
        {
            this->min_pivot = fmin(this->min_pivot, fabs(newpiv));
            this->max_pivot = fmax(this->max_pivot, fabs(newpiv));

            /* build row_reach and col_reach in topological order */
            nreach = nz_roweta + 1;
            row_reach = iwork1;
            col_reach = iwork2;
            row_reach[0] = ipivot;
            col_reach[0] = jpivot;
            pos = Rbegin[nforrest];
            for (n = 1; n < nreach; n++)
            {
                i = Lindex[pos++];
                row_reach[n] = i;
                col_reach[n] = qmap[i];
            }
            this->nsymperm_total++;
        }
    }
    else
    {
        /*
         * The spike has a zero diagonal element, so the spiked matrix may only
         * be the *un*symmetric permutation of an upper triangular matrix.
         *
         * Part 1:
         *
         * Find an augmenting path in U[pmap,:] starting from jpivot.
         * An augmenting path is a sequence of column indices such that there
         * is an edge from each node to the next, and an edge from the final
         * node back to jpivot.
         *
         * bfs_path computes such a path in path[top..m-1].
         *
         * Because jpivot has no self-edge, the path must have at least two
         * nodes. The path must exist because otherwise the spiked matrix was
         * structurally singular and the singularity test above had failed.
         */
        lu_int *path = iwork1, top;
        lu_int *reach = iwork2, rtop;
        lu_int *pstack = (void *) work1;

        top = bfs_path(m, jpivot, Wbegin, Wend, Windex, path, marked, iwork2);
        assert(top < m-1);
        assert(path[top] == jpivot);

        /*
         * Part 2a:
         *
         * For each path index j (except the final one) mark the nodes in
         * reach(j), where the reach is computed in U[pmap,:] without the path
         * edges. If a path index is contained in the reach of an index that
         * comes before it in the path, then U is not permuted triangular.
         *
         * At the same time assemble the combined reach of all path nodes
         * (except the final one) in U[pmap_new,:], where pmap_new is the
         * column-row mapping after applying the permutation associated with
         * the augmenting path. We only have to replace each index where the
         * dfs starts by the next index in the path. The combined reach is
         * then assembled in topological order in
         *
         *    reach[rtop..m-1].
         */
        istriangular = 1;
        rtop = m;
        M = ++this->marker;
        for (t = top; t < m-1 && istriangular; t++)
        {
            j = path[t];
            jnext = path[t+1];
            where = find(jnext, Windex, Wbegin[j], Wend[j]);
            assert(where < Wend[j]);
            Windex[where] = j;  /* take out for a moment */
            rtop = lu_dfs(j, Wbegin, Wend, Windex, rtop, reach, pstack, marked,
                          M);
            assert(reach[rtop] == j);
            reach[rtop] = jnext;
            Windex[where] = jnext; /* restore */
            istriangular = marked[jnext] != M;
        }

        /*
         * Part 2b:
         *
         * If the matrix looks triangular so far, then also mark the reach of
         * the final path node, which is reach(jpivot) in U[pmap_new,:].
         * U is then permuted triangular iff the combined reach does not
         * intersect the spike pattern except in the final path index.
         */
        if (istriangular)
        {
            j = path[m-1];
            rtop = lu_dfs(j, Wbegin, Wend, Windex, rtop, reach, pstack, marked,
                          M);
            assert(reach[rtop] == j);
            reach[rtop] = jpivot;
            marked[j]--;        /* unmark for a moment */
            for (pos = Ubegin[ipivot]; (i = Uindex[pos]) >= 0; pos++)
            {
                if (marked[qmap[i]] == M) istriangular = 0;
            }
            marked[j]++;        /* restore */
        }

        /*
         * If U is permuted triangular, then permute to zero-free diagonal.
         * Set up row_reach[0..nreach-1] and col_reach[0..nreach-1] for
         * updating the permutations below. The column reach is the combined
         * reach of the path nodes. The row reach is given through pmap.
         */
        if (istriangular)
        {
            lu_int nswap = m-top-1;
            permute(this, path+top, nswap);
            Unz--;
            assert(reach[rtop] == jpivot);
            col_reach = reach + rtop; /* stored in iwork2 */
            row_reach = iwork1 + rtop;
            nreach = m-rtop;
            for (n = 0; n < nreach; n++)
            {
                row_reach[n] = pmap[col_reach[n]];
            }
        }
    }

    /* --------------------- */
    /* Forrest-Tomlin update */
    /* --------------------- */

    if (!istriangular)
    {
        /* remove row ipivot from column file */
        for (pos = Wbegin[jpivot]; pos < Wend[jpivot]; pos++)
        {
            j = Windex[pos];
            assert(j != jpivot);
            where = -1;
            for (end = Ubegin[pmap[j]]; (i = Uindex[end]) >= 0; end++)
            {
                if (i == ipivot) where = end;
            }
            assert(where >= 0);
            Uindex[where] = Uindex[end-1];
            Uvalue[where] = Uvalue[end-1];
            Uindex[end-1] = -1;
            Unz--;
        }

        /* remove row ipivot from row file */
        Wend[jpivot] = Wbegin[jpivot];

        /* replace pivot */
        col_pivot[jpivot] = newpiv;
        row_pivot[ipivot] = newpiv;
        this->min_pivot = fmin(this->min_pivot, fabs(newpiv));
        this->max_pivot = fmax(this->max_pivot, fabs(newpiv));

        /* drop zeros from row eta; update max entry of row etas */
        nz = 0;
        put = Rbegin[nforrest];
        double max_eta = 0;
        for (pos = put; pos < Rbegin[nforrest+1]; pos++)
        {
            if (Lvalue[pos])
            {
                max_eta = fmax(max_eta, fabs(Lvalue[pos]));
                Lindex[put] = Lindex[pos];
                Lvalue[put++] = Lvalue[pos];
                nz++;
            }
        }
        Rbegin[nforrest+1] = put;
        this->Rnz += nz;
        this->max_eta = fmax(this->max_eta, max_eta);

        /* prepare permutation update */
        nreach = 1;
        row_reach = &ipivot;
        col_reach = &jpivot;
        this->nforrest++;
        this->nforrest_total++;
    }

    /* ------------------- */
    /* Update permutations */
    /* ------------------- */

    if (this->pivotlen + nreach > 2*m)
    {
        lu_garbage_perm(this);
    }

    /* append row indices row_reach[0..nreach-1] to end of pivot sequence */
    put = this->pivotlen;
    for (n = 0; n < nreach; n++) pivotrow[put++] = row_reach[n];

    /* append col indices col_reach[0..nreach-1] to end of pivot sequence */
    put = this->pivotlen;
    for (n = 0; n < nreach; n++) pivotcol[put++] = col_reach[n];

    this->pivotlen += nreach;

    /* -------- */
    /* Clean up */
    /* -------- */

    /* compress U if used memory is shrinked sufficiently */
    used = Ubegin[m];
    if (used-Unz-m > this->compress_thres * used)
    {
        nz = compress_packed(m, Ubegin, Uindex, Uvalue);
        assert(nz == Unz);
    }

    /* compress W if used memory is shrinked sufficiently */
    used = Wbegin[m];
    need = Unz + stretch*Unz + m*pad;
    if ((used-need) > this->compress_thres * used)
    {
        nz = lu_file_compress(m, Wbegin, Wend, Wflink, Windex, Wvalue,
                              stretch, pad);
        assert(nz == Unz);
    }

    this->pivot_error = piverr / (1.0 + fabs(newpiv));
    this->Unz = Unz;
    this->btran_for_update = -1;
    this->ftran_for_update = -1;
    this->update_cost_numer += nz_roweta;
    this->nupdate++;
    this->nupdate_total++;

    #ifdef DEBUG_EXTRA
    {
        lu_int col, row;
        check_consistency(this, &col, &row);
        assert(col < 0 && row < 0);
    }
    #endif
    return status;
}